

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O2

string * EncodeSecret_abi_cxx11_(string *__return_storage_ptr__,CKey *key)

{
  array<unsigned_char,_32UL> *__first;
  CChainParams *pCVar1;
  long in_FS_OFFSET;
  Span<const_unsigned_char> input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uchar local_39;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((key->keydata)._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
      (array<unsigned_char,_32UL> *)0x0) {
    __assert_fail("key.IsValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key_io.cpp"
                  ,0xe9,"std::string EncodeSecret(const CKey &)");
  }
  pCVar1 = Params();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
             pCVar1->base58Prefixes + 2);
  __first = (key->keydata)._M_t.
            super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_38,
             (const_iterator)local_38._M_impl.super__Vector_impl_data._M_finish,__first->_M_elems,
             __first[__first != (array<unsigned_char,_32UL> *)0x0]._M_elems);
  if (key->fCompressed == true) {
    local_39 = '\x01';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,&local_39);
  }
  input.m_size = (long)local_38._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_38._M_impl.super__Vector_impl_data._M_start;
  input.m_data = local_38._M_impl.super__Vector_impl_data._M_start;
  EncodeBase58Check_abi_cxx11_(__return_storage_ptr__,input);
  memory_cleanse(local_38._M_impl.super__Vector_impl_data._M_start,
                 (long)local_38._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_38._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string EncodeSecret(const CKey& key)
{
    assert(key.IsValid());
    std::vector<unsigned char> data = Params().Base58Prefix(CChainParams::SECRET_KEY);
    data.insert(data.end(), UCharCast(key.begin()), UCharCast(key.end()));
    if (key.IsCompressed()) {
        data.push_back(1);
    }
    std::string ret = EncodeBase58Check(data);
    memory_cleanse(data.data(), data.size());
    return ret;
}